

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateInternalForwardDeclarations
          (FileGenerator *this,CrossFileReferences *refs,Printer *printer)

{
  Options *file;
  Options *__return_storage_ptr__;
  string *__return_storage_ptr___00;
  cpp *this_00;
  Options *pOVar1;
  pointer ppFVar2;
  pointer ppDVar3;
  Formatter format;
  NamespaceOpener ns;
  undefined1 local_e8 [32];
  _Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  local_c8;
  Formatter local_b0;
  undefined1 local_78 [16];
  _Alloc_hider local_68;
  size_type sStack_60;
  undefined1 local_58 [40];
  
  local_b0.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_b0.vars_._M_t,&(this->variables_)._M_t);
  local_78._8_8_ = local_b0.printer_;
  local_68._M_p = (pointer)0x0;
  sStack_60 = 0;
  local_58._0_8_ = 0;
  pOVar1 = (Options *)local_e8;
  std::
  vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>::
  vector<std::__detail::_Node_const_iterator<google::protobuf::Descriptor_const*,true,false>,void>
            ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
              *)&local_c8,
             (_Node_const_iterator<const_google::protobuf::Descriptor_*,_true,_false>)
             (refs->weak_default_instances)._M_h._M_before_begin._M_nxt,
             (_Node_const_iterator<const_google::protobuf::Descriptor_*,_true,_false>)0x0,
             (allocator_type *)pOVar1);
  local_78._0_8_ = refs;
  std::
  __sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor_const**,std::vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*)>>
            ((__normal_iterator<const_google::protobuf::Descriptor_**,_std::vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>_>
              )local_c8._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_google::protobuf::Descriptor_**,_std::vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>_>
              )local_c8._M_impl.super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<bool_(*)(const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*)>
              )0x2cf59d);
  file = &this->options_;
  __return_storage_ptr__ = (Options *)(local_58 + 8);
  for (ppDVar3 = local_c8._M_impl.super__Vector_impl_data._M_start;
      ppDVar3 != local_c8._M_impl.super__Vector_impl_data._M_finish; ppDVar3 = ppDVar3 + 1) {
    this_00 = (cpp *)*ppDVar3;
    Namespace_abi_cxx11_((string *)local_e8,this_00,(Descriptor *)file,pOVar1);
    NamespaceOpener::ChangeTo((NamespaceOpener *)(local_78 + 8),(string *)local_e8);
    std::__cxx11::string::~string((string *)local_e8);
    if ((this->options_).lite_implicit_weak_fields == true) {
      DefaultInstanceType_abi_cxx11_((string *)local_e8,this_00,(Descriptor *)file,pOVar1);
      DefaultInstanceName_abi_cxx11_
                ((string *)__return_storage_ptr__,this_00,(Descriptor *)file,pOVar1);
      pOVar1 = __return_storage_ptr__;
      Formatter::operator()
                (&local_b0,"extern $1$ $2$;\n",(string *)local_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__);
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)local_e8);
      DefaultInstanceType_abi_cxx11_((string *)local_e8,this_00,(Descriptor *)file,pOVar1);
      DefaultInstancePtr_abi_cxx11_
                ((string *)__return_storage_ptr__,this_00,(Descriptor *)file,pOVar1);
      pOVar1 = __return_storage_ptr__;
      Formatter::operator()
                (&local_b0,"__attribute__((weak)) $1$* $2$ = nullptr;\n",(string *)local_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__);
    }
    else {
      DefaultInstanceType_abi_cxx11_((string *)local_e8,this_00,(Descriptor *)file,pOVar1);
      DefaultInstanceName_abi_cxx11_
                ((string *)__return_storage_ptr__,this_00,(Descriptor *)file,pOVar1);
      pOVar1 = __return_storage_ptr__;
      Formatter::operator()
                (&local_b0,"extern __attribute__((weak)) $1$ $2$;\n",(string *)local_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__);
    }
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)local_e8);
  }
  std::
  _Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::~_Vector_base(&local_c8);
  NamespaceOpener::~NamespaceOpener((NamespaceOpener *)(local_78 + 8));
  anon_unknown_57::Sorted<google::protobuf::FileDescriptor>
            ((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              *)local_e8,
             (unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              *)(local_78._0_8_ + 0x70));
  __return_storage_ptr___00 = (string *)(local_78 + 8);
  for (ppFVar2 = (pointer)local_e8._0_8_; ppFVar2 != (pointer)local_e8._8_8_; ppFVar2 = ppFVar2 + 1)
  {
    DescriptorTableName_abi_cxx11_
              (__return_storage_ptr___00,(cpp *)*ppFVar2,(FileDescriptor *)file,pOVar1);
    Formatter::operator()
              (&local_b0,
               "extern __attribute__((weak)) const ::$proto_ns$::internal::DescriptorTable $1$;\n",
               __return_storage_ptr___00);
    std::__cxx11::string::~string((string *)__return_storage_ptr___00);
  }
  std::
  _Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~_Vector_base((_Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   *)local_e8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_b0.vars_._M_t);
  return;
}

Assistant:

void FileGenerator::GenerateInternalForwardDeclarations(
    const CrossFileReferences& refs, io::Printer* printer) {
  Formatter format(printer, variables_);

  {
    NamespaceOpener ns(format);
    for (auto instance : Sorted(refs.weak_default_instances)) {
      ns.ChangeTo(Namespace(instance, options_));
      if (options_.lite_implicit_weak_fields) {
        format("extern $1$ $2$;\n", DefaultInstanceType(instance, options_),
               DefaultInstanceName(instance, options_));
        format("__attribute__((weak)) $1$* $2$ = nullptr;\n",
               DefaultInstanceType(instance, options_),
               DefaultInstancePtr(instance, options_));
      } else {
        format("extern __attribute__((weak)) $1$ $2$;\n",
               DefaultInstanceType(instance, options_),
               DefaultInstanceName(instance, options_));
      }
    }
  }

  for (auto file : Sorted(refs.weak_reflection_files)) {
    format(
        "extern __attribute__((weak)) const "
        "::$proto_ns$::internal::DescriptorTable $1$;\n",
        DescriptorTableName(file, options_));
  }
}